

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall
iDynTree::InverseKinematics::getJointLimits
          (InverseKinematics *this,
          vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          *jointLimits)

{
  missingIpoptErrorReport();
  return false;
}

Assistant:

bool InverseKinematics::getJointLimits(std::vector<std::pair<double, double> >& jointLimits)
    {
#ifdef IDYNTREE_USES_IPOPT
      assert(m_pimpl);
      return IK_PIMPL(m_pimpl)->getJointLimits(jointLimits);
#else
        return missingIpoptErrorReport();
#endif
    }